

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O0

void __thiscall
adios2::core::Attribute<std::complex<float>_>::~Attribute(Attribute<std::complex<float>_> *this)

{
  undefined8 *in_RDI;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Attribute_0112b200;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector(unaff_retaddr);
  AttributeBase::~AttributeBase((AttributeBase *)0x82dd04);
  return;
}

Assistant:

~Attribute() = default;